

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O1

void __thiscall
duckdb::AlpRDScanState<double>::LoadVector<true>
          (AlpRDScanState<double> *this,EXACT_TYPE *value_buffer)

{
  byte bVar1;
  ushort uVar2;
  data_ptr_t pdVar3;
  unsigned_long uVar4;
  int remainder;
  uint val;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  data_ptr_t pdVar8;
  
  (this->vector_state).index = 0;
  pdVar3 = this->metadata_ptr;
  pdVar8 = this->segment_data;
  this->metadata_ptr = pdVar3 + -4;
  uVar6 = (ulong)*(uint *)(pdVar3 + -4);
  uVar7 = this->count - this->total_value_count;
  if (0x3ff < uVar7) {
    uVar7 = 0x400;
  }
  (this->vector_state).exceptions_count = *(uint16_t *)(pdVar8 + uVar6);
  bVar1 = (this->vector_state).left_bit_width;
  val = (uint)uVar7 & 0x1f;
  uVar5 = uVar7;
  if ((uVar7 & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    uVar5 = (uVar7 - uVar4) + 0x20;
  }
  pdVar8 = pdVar8 + uVar6 + 2;
  uVar6 = uVar5 * bVar1 >> 3;
  bVar1 = (this->vector_state).right_bit_width;
  if ((uVar7 & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    uVar7 = (uVar7 - uVar4) + 0x20;
  }
  uVar7 = uVar7 * bVar1 >> 3;
  switchD_00b1522a::default((this->vector_state).left_encoded,pdVar8,uVar6);
  pdVar8 = pdVar8 + uVar6;
  switchD_00b1522a::default((this->vector_state).right_encoded,pdVar8,uVar7);
  uVar2 = (this->vector_state).exceptions_count;
  if (uVar2 != 0) {
    switchD_00b1522a::default
              ((this->vector_state).exceptions,pdVar8 + uVar7,(ulong)((uint)uVar2 * 2));
    uVar6 = (ulong)((uint)(this->vector_state).exceptions_count * 2);
    switchD_00b1522a::default
              ((this->vector_state).exceptions_positions,pdVar8 + uVar7 + uVar6,uVar6);
    return;
  }
  return;
}

Assistant:

void LoadVector(EXACT_TYPE *value_buffer) {
		vector_state.Reset();

		// Load the offset (metadata) indicating where the vector data starts
		metadata_ptr -= AlpRDConstants::METADATA_POINTER_SIZE;
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());

		idx_t vector_size = MinValue((idx_t)AlpRDConstants::ALP_VECTOR_SIZE, (count - total_value_count));

		data_ptr_t vector_ptr = segment_data + data_byte_offset;

		// Load the vector data
		vector_state.exceptions_count = Load<uint16_t>(vector_ptr);
		vector_ptr += AlpRDConstants::EXCEPTIONS_COUNT_SIZE;
		D_ASSERT(vector_state.exceptions_count <= vector_size);

		auto left_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.left_bit_width);
		auto right_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.right_bit_width);

		memcpy(vector_state.left_encoded, (void *)vector_ptr, left_bp_size);
		vector_ptr += left_bp_size;

		memcpy(vector_state.right_encoded, (void *)vector_ptr, right_bp_size);
		vector_ptr += right_bp_size;

		if (vector_state.exceptions_count > 0) {
			memcpy(vector_state.exceptions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count);
			vector_ptr += AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count;
			memcpy(vector_state.exceptions_positions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_POSITION_SIZE * vector_state.exceptions_count);
		}

		// Decode all the vector values to the specified 'value_buffer'
		vector_state.template LoadValues<SKIP>(value_buffer, vector_size);
	}